

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clear(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  long lVar1;
  bool bVar2;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  SPxMemoryException *x;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffe78;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe88;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffe90;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe98;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *this_00;
  undefined1 local_154 [16];
  int in_stack_fffffffffffffebc;
  int **in_stack_fffffffffffffec0;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4 [3];
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined4 *local_a0;
  uint *local_98;
  undefined4 *local_90;
  uint *local_88;
  undefined4 *local_80;
  uint *local_78;
  undefined4 *local_70;
  uint *local_68;
  undefined4 *local_60;
  uint *local_58;
  undefined1 *local_50;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  undefined1 *local_8;
  
  local_c4[0] = 5;
  local_58 = in_RDI[2].data._M_elems + 7;
  local_60 = local_c4;
  local_30 = local_60;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,(long_long_type)in_stack_fffffffffffffe78);
  local_c8 = 5;
  local_68 = in_RDI[3].data._M_elems + 7;
  local_70 = &local_c8;
  local_28 = local_70;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,(long_long_type)in_stack_fffffffffffffe78);
  local_cc = 1;
  local_78 = in_RDI[4].data._M_elems + 7;
  local_80 = &local_cc;
  local_20 = local_80;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,(long_long_type)in_stack_fffffffffffffe78);
  in_RDI[5].data._M_elems[0x1b] = 0;
  in_RDI[5].exp = 0;
  (in_RDI->data)._M_elems[5] = 0;
  *(undefined1 *)(in_RDI[10].data._M_elems + 8) = 0;
  local_d0 = 1;
  local_88 = in_RDI[1].data._M_elems + 7;
  local_90 = &local_d0;
  local_18 = local_90;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,(long_long_type)in_stack_fffffffffffffe78);
  local_d4 = 1;
  local_98 = (in_RDI->data)._M_elems + 7;
  local_a0 = &local_d4;
  local_10 = local_a0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,(long_long_type)in_stack_fffffffffffffe78);
  local_40 = in_RDI[0xc].data._M_elems + 0x12;
  local_38 = in_RDI[0xb].data._M_elems + 0x12;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_fffffffffffffe78);
  this_00 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x3fa47ae147ae147b;
  local_a8 = local_154;
  local_b0 = &stack0xfffffffffffffea0;
  local_b8 = 0;
  local_8 = local_b0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffe90,(double)in_stack_fffffffffffffe88,in_RDI);
  local_48 = in_RDI[0xd].data._M_elems + 0x12;
  local_50 = local_154;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_fffffffffffffe78);
  (in_RDI->data)._M_elems[4] = 4;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(in_stack_fffffffffffffe98);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(in_stack_fffffffffffffe88);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(in_stack_fffffffffffffe88);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(in_stack_fffffffffffffe88);
  in_RDI[7].data._M_elems[0] = 100;
  in_RDI[7].data._M_elems[0x18] = 100;
  in_RDI[5].data._M_elems[0x10] = 100;
  in_RDI[5].data._M_elems[0x1a] = 100;
  if (*(long *)(in_RDI[6].data._M_elems + 10) != 0) {
    spx_free<int*>((int **)0x6cc974);
  }
  if (*(long *)(in_RDI[6].data._M_elems + 0xc) != 0) {
    spx_free<int*>((int **)0x6cc99c);
  }
  if (*(long *)(in_RDI[6].data._M_elems + 0xe) != 0) {
    spx_free<int*>((int **)0x6cc9c4);
  }
  if (*(long *)(in_RDI[6].data._M_elems + 0x10) != 0) {
    spx_free<int*>((int **)0x6cc9ef);
  }
  bVar2 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   *)in_stack_fffffffffffffe90);
  if (!bVar2) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x6cca25);
  }
  if (*(long *)(in_RDI[7].data._M_elems + 8) != 0) {
    spx_free<int*>((int **)0x6cca4d);
  }
  if (*(long *)(in_RDI[7].data._M_elems + 0x1a) != 0) {
    spx_free<int*>((int **)0x6cca79);
  }
  bVar2 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   *)in_stack_fffffffffffffe90);
  if (bVar2) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x6ccab1);
  }
  if (*(long *)(in_RDI[5].data._M_elems + 0x18) != 0) {
    spx_free<int*>((int **)0x6ccad9);
  }
  lVar1._0_4_ = in_RDI[5].fpclass;
  lVar1._4_4_ = in_RDI[5].prec_elem;
  if (lVar1 != 0) {
    spx_free<int*>((int **)0x6ccb01);
  }
  if (*(long *)in_RDI[6].data._M_elems != 0) {
    spx_free<int*>((int **)0x6ccb29);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(this_00,(size_type)in_stack_fffffffffffffe98);
  spx_alloc<int*>(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  spx_alloc<int*>(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(this_00,(size_type)in_stack_fffffffffffffe98);
  spx_alloc<int*>(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  spx_alloc<int*>(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  spx_alloc<int*>(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  return;
}

Assistant:

void SLUFactor<R>::clear()
{

   this->rowMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   this->colMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   this->lMemMult      = 1;          /* factor of minimum Memory * #of nonzeros */

   this->l.firstUpdate = 0;
   this->l.firstUnused = 0;
   this->thedim        = 0;

   usetup        = false;
   this->maxabs        = 1;
   this->initMaxabs    = 1;
   lastThreshold = minThreshold;
   minStability  = SOPLEX_MINSTABILITY;
   this->stat          = this->UNLOADED;

   vec.clear();
   eta.clear();
   ssvec.clear();
   forest.clear();

   this->u.row.size    = 100;
   this->u.col.size    = 100;
   this->l.size        = 100;
   this->l.startSize   = 100;

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);

   // G clear() is used in constructor of SLUFactor<R> so we have to
   // G clean up if anything goes wrong here
   try
   {
      this->u.row.val.resize(this->u.row.size);
      spx_alloc(this->u.row.idx, this->u.row.size);
      spx_alloc(this->u.col.idx, this->u.col.size);

      this->l.val.resize(this->l.size);
      spx_alloc(this->l.idx,   this->l.size);
      spx_alloc(this->l.start, this->l.startSize);
      spx_alloc(this->l.row,   this->l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }
}